

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat64x2Operation::OpSelect(SIMDValue *mV,SIMDValue *tV,SIMDValue *fV)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  _x86_SIMDValue _Var3;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar4;
  X86SIMDValue tempFalse;
  X86SIMDValue tempTrue;
  X86SIMDValue falseValue;
  X86SIMDValue trueValue;
  X86SIMDValue maskValue;
  X86SIMDValue x86Result;
  SIMDValue *fV_local;
  SIMDValue *tV_local;
  SIMDValue *mV_local;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(mV);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(tV);
  _Var3 = _x86_SIMDValue::ToX86SIMDValue(fV);
  trueValue.field_0.i64[1] = _Var1.field_0._0_8_;
  falseValue.field_0.i64[1] = _Var2.field_0._0_8_;
  tempTrue.field_0.i64[1] = _Var3.field_0._0_8_;
  maskValue.field_0.i64[1] =
       trueValue.field_0.i64[1] & falseValue.field_0.i64[1] |
       ~trueValue.field_0.i64[1] & tempTrue.field_0.i64[1];
  aVar4 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&maskValue.field_0 + 8));
  return (SIMDValue)aVar4;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpSelect(const SIMDValue& mV, const SIMDValue& tV, const SIMDValue& fV)
    {
        X86SIMDValue x86Result;
        X86SIMDValue maskValue  = X86SIMDValue::ToX86SIMDValue(mV);
        X86SIMDValue trueValue  = X86SIMDValue::ToX86SIMDValue(tV);
        X86SIMDValue falseValue = X86SIMDValue::ToX86SIMDValue(fV);

        X86SIMDValue tempTrue, tempFalse;
        tempTrue.m128d_value = _mm_and_pd(maskValue.m128d_value, trueValue.m128d_value);      // mask & True
        tempFalse.m128d_value = _mm_andnot_pd(maskValue.m128d_value, falseValue.m128d_value); // !mask & False
        x86Result.m128d_value = _mm_or_pd(tempTrue.m128d_value, tempFalse.m128d_value); // tempTrue | tempFalse

        return X86SIMDValue::ToSIMDValue(x86Result);
    }